

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegionPrivate * qt_bitmapToRegion(QBitmap *bitmap)

{
  Format FVar1;
  int iVar2;
  Representation RVar3;
  QRegionPrivate *this;
  uchar *puVar4;
  byte bVar5;
  Representation i;
  int iVar6;
  Representation RVar7;
  int iVar8;
  byte bVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QRect local_68;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage((QImage *)local_58,&bitmap->super_QPixmap);
  this = (QRegionPrivate *)operator_new(0x40);
  QRegionPrivate::QRegionPrivate(this);
  local_68.x1.m_i = 0;
  local_68.y1.m_i = 0;
  local_68.x2.m_i = -1;
  local_68.y2.m_i = -1;
  FVar1 = QImage::format((QImage *)local_58);
  i.m_i = 0;
  while( true ) {
    iVar2 = QImage::height((QImage *)local_58);
    if (iVar2 <= i.m_i) break;
    puVar4 = QImage::constScanLine((QImage *)local_58,i.m_i);
    iVar2 = QImage::width((QImage *)local_58);
    iVar8 = 0;
    bVar5 = 0;
    RVar7.m_i = -1;
    while (iVar8 < iVar2) {
      bVar9 = puVar4[iVar8 / 8];
      if ((iVar2 + -8 < iVar8) || (bVar9 != bVar5)) {
        if (FVar1 == Format_MonoLSB) {
          iVar6 = -8;
          for (; (iVar6 != 0 && (iVar8 < iVar2)); iVar8 = iVar8 + 1) {
            RVar3.m_i = RVar7.m_i;
            if (((bVar5 != 0) != (bool)(bVar9 & 1)) &&
               (bVar10 = bVar5 != 0, bVar5 = 0xff, RVar3.m_i = iVar8, bVar10)) {
              local_68.y1.m_i = i.m_i;
              local_68.x1.m_i = RVar7.m_i;
              local_68.y2.m_i = i.m_i;
              local_68.x2.m_i = iVar8 + -1;
              UnionRectWithRegion(&local_68,this,this);
              bVar5 = 0;
              RVar3.m_i = RVar7.m_i;
            }
            bVar9 = bVar9 >> 1;
            iVar6 = iVar6 + 1;
            RVar7.m_i = RVar3.m_i;
          }
        }
        else {
          iVar6 = -8;
          for (; (iVar6 != 0 && (iVar8 < iVar2)); iVar8 = iVar8 + 1) {
            RVar3.m_i = RVar7.m_i;
            if (((bVar5 != 0) == -1 < (char)bVar9) &&
               (bVar10 = bVar5 != 0, bVar5 = 0xff, RVar3.m_i = iVar8, bVar10)) {
              local_68.y1.m_i = i.m_i;
              local_68.x1.m_i = RVar7.m_i;
              local_68.y2.m_i = i.m_i;
              local_68.x2.m_i = iVar8 + -1;
              UnionRectWithRegion(&local_68,this,this);
              bVar5 = 0;
              RVar3.m_i = RVar7.m_i;
            }
            bVar9 = bVar9 * '\x02';
            iVar6 = iVar6 + 1;
            RVar7.m_i = RVar3.m_i;
          }
        }
      }
      else {
        iVar8 = iVar8 + 8;
      }
    }
    if (bVar5 != 0) {
      local_68.y1.m_i = i.m_i;
      local_68.x1.m_i = RVar7.m_i;
      local_68.y2.m_i = i.m_i;
      local_68.x2.m_i = iVar8 + -1;
      UnionRectWithRegion(&local_68,this,this);
    }
    i.m_i = i.m_i + 1;
  }
  QImage::~QImage((QImage *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QRegionPrivate *qt_bitmapToRegion(const QBitmap& bitmap)
{
    const QImage image = bitmap.toImage();

    QRegionPrivate *region = new QRegionPrivate;

    QRect xr;

#define AddSpan \
        { \
            xr.setCoords(prev1, y, x-1, y); \
            UnionRectWithRegion(&xr, region, *region); \
        }

    const uchar zero = 0;
    bool little = image.format() == QImage::Format_MonoLSB;

    int x,
        y;
    for (y = 0; y < image.height(); ++y) {
        const uchar *line = image.constScanLine(y);
        int w = image.width();
        uchar all = zero;
        int prev1 = -1;
        for (x = 0; x < w;) {
            uchar byte = line[x / 8];
            if (x > w - 8 || byte!=all) {
                if (little) {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x01) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all!=zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte >>= 1;
                        ++x;
                    }
                } else {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x80) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all != zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte <<= 1;
                        ++x;
                    }
                }
            } else {
                x += 8;
            }
        }
        if (all != zero) {
            AddSpan
        }
    }
#undef AddSpan

    return region;
}